

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__simple_flip_3ch(float *decode_buffer,int width_times_channels)

{
  float fVar1;
  float t;
  float i23;
  float i21;
  __m128 g;
  __m128 f;
  __m128 e;
  __m128 d;
  __m128 c;
  __m128 b;
  __m128 a;
  float *end_decode;
  float *decode;
  int width_times_channels_local;
  float *decode_buffer_local;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  for (end_decode = decode_buffer; end_decode <= decode_buffer + width_times_channels + -0x18;
      end_decode = end_decode + 0x18) {
    local_18 = (undefined4)*(undefined8 *)end_decode;
    uStack_14 = (undefined4)((ulong)*(undefined8 *)end_decode >> 0x20);
    uStack_10 = (undefined4)*(undefined8 *)(end_decode + 2);
    uStack_c = (undefined4)((ulong)*(undefined8 *)(end_decode + 2) >> 0x20);
    local_28 = (undefined4)*(undefined8 *)(end_decode + 3);
    uStack_24 = (undefined4)((ulong)*(undefined8 *)(end_decode + 3) >> 0x20);
    uStack_20 = (undefined4)*(undefined8 *)(end_decode + 5);
    uStack_1c = (undefined4)((ulong)*(undefined8 *)(end_decode + 5) >> 0x20);
    local_38 = (undefined4)*(undefined8 *)(end_decode + 6);
    uStack_34 = (undefined4)((ulong)*(undefined8 *)(end_decode + 6) >> 0x20);
    uStack_30 = (undefined4)*(undefined8 *)(end_decode + 8);
    uStack_2c = (undefined4)((ulong)*(undefined8 *)(end_decode + 8) >> 0x20);
    local_48 = (undefined4)*(undefined8 *)(end_decode + 9);
    uStack_44 = (undefined4)((ulong)*(undefined8 *)(end_decode + 9) >> 0x20);
    uStack_40 = (undefined4)*(undefined8 *)(end_decode + 0xb);
    uStack_3c = (undefined4)((ulong)*(undefined8 *)(end_decode + 0xb) >> 0x20);
    local_58 = (undefined4)*(undefined8 *)(end_decode + 0xc);
    uStack_54 = (undefined4)((ulong)*(undefined8 *)(end_decode + 0xc) >> 0x20);
    uStack_50 = (undefined4)*(undefined8 *)(end_decode + 0xe);
    uStack_4c = (undefined4)((ulong)*(undefined8 *)(end_decode + 0xe) >> 0x20);
    local_68 = (undefined4)*(undefined8 *)(end_decode + 0xf);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(end_decode + 0xf) >> 0x20);
    uStack_60 = (undefined4)*(undefined8 *)(end_decode + 0x11);
    uStack_5c = (undefined4)((ulong)*(undefined8 *)(end_decode + 0x11) >> 0x20);
    local_78 = (undefined4)*(undefined8 *)(end_decode + 0x12);
    uStack_74 = (undefined4)((ulong)*(undefined8 *)(end_decode + 0x12) >> 0x20);
    uStack_70 = (undefined4)*(undefined8 *)(end_decode + 0x14);
    uStack_6c = (undefined4)((ulong)*(undefined8 *)(end_decode + 0x14) >> 0x20);
    *(ulong *)end_decode = CONCAT44(uStack_14,uStack_10);
    *(ulong *)(end_decode + 2) = CONCAT44(uStack_c,local_18);
    fVar1 = end_decode[0x15];
    *(ulong *)(end_decode + 3) = CONCAT44(uStack_24,uStack_20);
    *(ulong *)(end_decode + 5) = CONCAT44(uStack_1c,local_28);
    *(ulong *)(end_decode + 6) = CONCAT44(uStack_34,uStack_30);
    *(ulong *)(end_decode + 8) = CONCAT44(uStack_2c,local_38);
    *(ulong *)(end_decode + 9) = CONCAT44(uStack_44,uStack_40);
    *(ulong *)(end_decode + 0xb) = CONCAT44(uStack_3c,local_48);
    *(ulong *)(end_decode + 0xc) = CONCAT44(uStack_54,uStack_50);
    *(ulong *)(end_decode + 0xe) = CONCAT44(uStack_4c,local_58);
    *(ulong *)(end_decode + 0xf) = CONCAT44(uStack_64,uStack_60);
    *(ulong *)(end_decode + 0x11) = CONCAT44(uStack_5c,local_68);
    *(ulong *)(end_decode + 0x12) = CONCAT44(uStack_74,uStack_70);
    *(ulong *)(end_decode + 0x14) = CONCAT44(uStack_6c,local_78);
    end_decode[0x15] = end_decode[0x17];
    end_decode[0x17] = fVar1;
  }
  for (; end_decode < decode_buffer + width_times_channels; end_decode = end_decode + 3) {
    fVar1 = *end_decode;
    *end_decode = end_decode[2];
    end_decode[2] = fVar1;
  }
  return;
}

Assistant:

static void stbir__simple_flip_3ch( float * decode_buffer, int width_times_channels )
{
  float STBIR_STREAMOUT_PTR(*) decode = decode_buffer;
  float const * end_decode = decode_buffer + width_times_channels;

#ifdef STBIR_SIMD
    #ifdef stbir__simdf_swiz2 // do we have two argument swizzles?
      end_decode -= 12; 
      STBIR_NO_UNROLL_LOOP_START
      while( decode <= end_decode )
      {
        // on arm64 8 instructions, no overlapping stores
        stbir__simdf a,b,c,na,nb;
        STBIR_SIMD_NO_UNROLL(decode);
        stbir__simdf_load( a, decode );
        stbir__simdf_load( b, decode+4 );
        stbir__simdf_load( c, decode+8 );

        na = stbir__simdf_swiz2( a, b, 2, 1, 0, 5 );   
        b  = stbir__simdf_swiz2( a, b, 4, 3, 6, 7 );   
        nb = stbir__simdf_swiz2( b, c, 0, 1, 4, 3 );   
        c  = stbir__simdf_swiz2( b, c, 2, 7, 6, 5 );   

        stbir__simdf_store( decode, na );
        stbir__simdf_store( decode+4, nb ); 
        stbir__simdf_store( decode+8, c );
        decode += 12;
      }
      end_decode += 12;
    #else
      end_decode -= 24;
      STBIR_NO_UNROLL_LOOP_START
      while( decode <= end_decode )
      {
        // 26 instructions on x64
        stbir__simdf a,b,c,d,e,f,g;
        float i21, i23;
        STBIR_SIMD_NO_UNROLL(decode);
        stbir__simdf_load( a, decode );
        stbir__simdf_load( b, decode+3 );
        stbir__simdf_load( c, decode+6 );
        stbir__simdf_load( d, decode+9 );
        stbir__simdf_load( e, decode+12 );
        stbir__simdf_load( f, decode+15 );
        stbir__simdf_load( g, decode+18 );

        a = stbir__simdf_swiz( a, 2, 1, 0, 3 );   
        b = stbir__simdf_swiz( b, 2, 1, 0, 3 );   
        c = stbir__simdf_swiz( c, 2, 1, 0, 3 );   
        d = stbir__simdf_swiz( d, 2, 1, 0, 3 );   
        e = stbir__simdf_swiz( e, 2, 1, 0, 3 );   
        f = stbir__simdf_swiz( f, 2, 1, 0, 3 );   
        g = stbir__simdf_swiz( g, 2, 1, 0, 3 );   

        // stores overlap, need to be in order, 
        stbir__simdf_store( decode,    a );
        i21 = decode[21];
        stbir__simdf_store( decode+3,  b ); 
        i23 = decode[23];
        stbir__simdf_store( decode+6,  c );
        stbir__simdf_store( decode+9,  d );
        stbir__simdf_store( decode+12, e );
        stbir__simdf_store( decode+15, f );
        stbir__simdf_store( decode+18, g );
        decode[21] = i23;
        decode[23] = i21;
        decode += 24;
      }
      end_decode += 24;
    #endif
#else
  end_decode -= 12;
  STBIR_NO_UNROLL_LOOP_START
  while( decode <= end_decode )
  {
    // 16 instructions
    float t0,t1,t2,t3;
    STBIR_NO_UNROLL(decode);
    t0 = decode[0]; t1 = decode[3]; t2 = decode[6]; t3 = decode[9];
    decode[0] = decode[2]; decode[3] = decode[5]; decode[6] = decode[8]; decode[9] = decode[11];
    decode[2] = t0; decode[5] = t1; decode[8] = t2; decode[11] = t3;
    decode += 12;
  }
  end_decode += 12;
#endif

  STBIR_NO_UNROLL_LOOP_START
  while( decode < end_decode )
  {
    float t = decode[0];
    STBIR_NO_UNROLL(decode);
    decode[0] = decode[2];
    decode[2] = t;
    decode += 3;
  }
}